

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  undefined1 *puVar1;
  allocator local_6a;
  allocator local_69;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0013df28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_48,key,&local_69);
  std::__cxx11::string::string((string *)local_68,value,&local_6a);
  (**(code **)(*(long *)device + 0x2f8))(device,local_48,local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}